

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  ushort uVar1;
  undefined2 uVar2;
  int iVar3;
  size_t sVar4;
  
  uVar1 = pMem->flags;
  if (pMem->szMalloc < 0x20) {
    iVar3 = sqlite3VdbeMemGrow(pMem,0x20,0);
    if (iVar3 != 0) {
      pMem->enc = '\0';
      return 7;
    }
  }
  else {
    pMem->z = pMem->zMalloc;
    pMem->flags = uVar1 & 0xd;
  }
  if ((uVar1 & 4) == 0) {
    sqlite3_snprintf(0x20,pMem->z,"%!.15g",(pMem->u).r);
  }
  else {
    sqlite3_snprintf(0x20,pMem->z,"%lld",(pMem->u).r);
  }
  sVar4 = strlen(pMem->z);
  pMem->n = (uint)sVar4 & 0x3fffffff;
  pMem->enc = '\x01';
  uVar2 = pMem->flags;
  uVar1 = uVar2 & 0xfff3;
  if (bForce == '\0') {
    uVar1 = uVar2;
  }
  pMem->flags = uVar1 | 0x202;
  if (enc != '\x01') {
    sqlite3VdbeMemTranslate(pMem,enc);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  int fg = pMem->flags;
  const int nByte = 32;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(fg&MEM_Zero) );
  assert( !(fg&(MEM_Str|MEM_Blob)) );
  assert( fg&(MEM_Int|MEM_Real) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    pMem->enc = 0;
    return SQLITE_NOMEM_BKPT;
  }

  /* For a Real or Integer, use sqlite3_snprintf() to produce the UTF-8
  ** string representation of the value. Then, if the required encoding
  ** is UTF-16le or UTF-16be do a translation.
  ** 
  ** FIX ME: It would be better if sqlite3_snprintf() could do UTF-16.
  */
  if( fg & MEM_Int ){
    sqlite3_snprintf(nByte, pMem->z, "%lld", pMem->u.i);
  }else{
    assert( fg & MEM_Real );
    sqlite3_snprintf(nByte, pMem->z, "%!.15g", pMem->u.r);
  }
  assert( pMem->z!=0 );
  pMem->n = sqlite3Strlen30NN(pMem->z);
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}